

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_XYZfunctions.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionPosition_XYZfunctions::ArchiveIN
          (ChFunctionPosition_XYZfunctions *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionPosition_XYZfunctions>(marchive);
  ChFunctionPosition::ArchiveIN(&this->super_ChFunctionPosition,marchive);
  local_38._value = &this->px;
  local_38._name = "px";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->py;
  local_38._name = "py";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->pz;
  local_38._name = "pz";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionPosition_XYZfunctions::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionPosition_XYZfunctions>();
	// deserialize parent class
    ChFunctionPosition::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(px);
	marchive >> CHNVP(py);
	marchive >> CHNVP(pz);
}